

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderDrawPrimitivesDoNotMatchOutputPrimitives::iterate
          (GeometryShaderDrawPrimitivesDoNotMatchOutputPrimitives *this)

{
  GLuint *pGVar1;
  ostringstream *poVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  bool has_shader_compilation_failed;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *gs_code;
  string vs_code_specialized;
  string gs_code_specialized;
  string fs_code_specialized;
  char *vs_code_specialized_raw;
  char *tf_varyings [1];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar7;
  
  gs_code = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (lines)                            in;\nlayout (triangle_strip, max_vertices = 3) out;\n\nout vec4 out_gs_1;\n\nvoid main()\n{\n    out_gs_1 = vec4(4.0, 3.0, 2.0, 1.0);\n\n    gl_Position = vec4(0, 0, 0, 1);\n    EmitVertex();\n\n    gl_Position = vec4(1, 0, 0, 1);\n    EmitVertex();\n\n    gl_Position = vec4(1, 1, 0, 1);\n    EmitVertex();\n\n    EndPrimitive();}\n"
  ;
  has_shader_compilation_failed = true;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0xfcf);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  GVar5 = (**(code **)(lVar7 + 0x3c8))();
  this->m_po_id = GVar5;
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xfd6);
  tf_varyings[0] = "out_gs_1";
  (**(code **)(lVar7 + 0x14c8))(this->m_po_id,1,tf_varyings,0x8c8c);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xfdc);
  GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar5;
  GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar5;
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xfe2);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&gs_code_specialized,&this->super_TestCaseBase,1,&gs_code);
  gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&dummy_vs_code);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  bVar3 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,
                     &fs_code_specialized_raw,this->m_gs_id,1,&gs_code_specialized_raw,this->m_vs_id
                     ,1,&vs_code_specialized_raw,&has_shader_compilation_failed);
  if (bVar3) {
    (**(code **)(lVar7 + 0x708))(1,&this->m_vao_id);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenVertexArrays() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xffc);
    (**(code **)(lVar7 + 0xd8))(this->m_vao_id);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindVertexArray() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0xfff);
    pGVar1 = &this->m_tfbo_id;
    (**(code **)(lVar7 + 0x6c8))(1,pGVar1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenBuffers() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1003);
    (**(code **)(lVar7 + 0x40))(0x8892,*pGVar1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1006);
    (**(code **)(lVar7 + 0x150))(0x8892,0x30,0,0x88e1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBufferData() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x100b);
    (**(code **)(lVar7 + 0x48))(0x8c8e,0,*pGVar1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindBufferBase() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x100e);
    (**(code **)(lVar7 + 0x1680))(this->m_po_id);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glUseProgram() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1012);
    (**(code **)(lVar7 + 0x5e0))(0x8c89);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glEnable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1015);
    (**(code **)(lVar7 + 0x30))(1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBeginTransformFeedback() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1018);
    (**(code **)(lVar7 + 0x538))(4,0,3);
    iVar4 = (**(code **)(lVar7 + 0x800))();
    if (iVar4 != 0x502) {
      local_1a8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Error different than GL_INVALID_OPEARATION was generated.",0x39)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_130);
    }
    (**(code **)(lVar7 + 0x638))();
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glEndTransformFeedback() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1027);
    (**(code **)(lVar7 + 0x4e8))(0x8c89);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glDisable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x102a);
    if (iVar4 == 0x502) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00cee098;
    }
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Program object linking failed whereas a success was expected.",
               0x3d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_130);
  }
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00cee098:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
    operator_delete(vs_code_specialized._M_dataplus._M_p,
                    vs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
    operator_delete(gs_code_specialized._M_dataplus._M_p,
                    gs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
    operator_delete(fs_code_specialized._M_dataplus._M_p,
                    fs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderDrawPrimitivesDoNotMatchOutputPrimitives::iterate()
{
	/* Define Geometry Shader for purpose of this test. */
	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (lines)                            in;\n"
						  "layout (triangle_strip, max_vertices = 3) out;\n"
						  "\n"
						  "out vec4 out_gs_1;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    out_gs_1 = vec4(4.0, 3.0, 2.0, 1.0);\n"
						  "\n"
						  "    gl_Position = vec4(0, 0, 0, 1);\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position = vec4(1, 0, 0, 1);\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position = vec4(1, 1, 0, 1);\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    EndPrimitive();"
						  "}\n";

	bool		has_shader_compilation_failed = true;
	bool		result						  = true;
	glw::GLenum error						  = GL_NO_ERROR;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program object. */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Specify output variables to be captured. */
	const char* tf_varyings[] = { "out_gs_1" };

	gl.transformFeedbackVaryings(m_po_id, 1 /*count*/, tf_varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call(s) failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_code_specialized		= specializeShader(1, &gs_code);
	const char* gs_code_specialized_raw = gs_code_specialized.c_str();

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	if (!TestCaseBase::buildProgram(m_po_id, m_fs_id, 1,				  /* n_sh1_body_parts */
									&fs_code_specialized_raw, m_gs_id, 1, /* n_sh2_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh3_body_parts */
									&vs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed whereas a success was expected."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create Vertex Array Object. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call(s) failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call(s) failed.");

	/* Create Buffer Object for Transform Feedback data. */
	gl.genBuffers(1, &m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call(s) failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call(s) failed.");

	gl.bufferData(GL_ARRAY_BUFFER,
				  sizeof(glw::GLfloat) * 4 * 3 /* capture 4 float vector components times 3 triangle vertices */, NULL,
				  GL_STREAM_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call(s) failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /*binding index*/, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call(s) failed.");

	/* Turn on program object. */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call(s) failed.");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call(s) failed.");

	gl.beginTransformFeedback(GL_LINES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call(s) failed.");

	gl.drawArrays(GL_TRIANGLES, 0 /*first*/, 3 /*count*/);

	error = gl.getError();

	if (error != GL_INVALID_OPERATION)
	{
		result = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Error different than GL_INVALID_OPEARATION was generated."
						   << tcu::TestLog::EndMessage;
	}

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call(s) failed.");

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call(s) failed.");

end:

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}